

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_write_float_to_int16(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  uint local_34;
  OPJ_UINT32 l_temp;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *l_src_data;
  OPJ_BYTE *l_dest_data;
  OPJ_UINT32 p_nb_elem_local;
  void *p_dest_data_local;
  void *p_src_data_local;
  
  _l_temp = (float *)p_src_data;
  l_src_data = (OPJ_FLOAT32 *)p_dest_data;
  for (local_34 = 0; local_34 < p_nb_elem; local_34 = local_34 + 1) {
    opj_write_bytes_LE((OPJ_BYTE *)l_src_data,(OPJ_UINT32)(long)*_l_temp,2);
    l_src_data = (OPJ_FLOAT32 *)((long)l_src_data + 2);
    _l_temp = _l_temp + 1;
  }
  return;
}

Assistant:

static void  opj_j2k_write_float_to_int16(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_dest_data = (OPJ_BYTE *) p_dest_data;
    OPJ_FLOAT32 * l_src_data = (OPJ_FLOAT32 *) p_src_data;
    OPJ_UINT32 i;
    OPJ_UINT32 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        l_temp = (OPJ_UINT32) * (l_src_data++);

        opj_write_bytes(l_dest_data, l_temp, sizeof(OPJ_INT16));

        l_dest_data += sizeof(OPJ_INT16);
    }
}